

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::TrackTempObjectSyms(GlobOpt *this,Instr *instr,RegOpnd *opnd)

{
  ushort uVar1;
  BVIndex i;
  BasicBlock *pBVar2;
  Opnd *pOVar3;
  Type pJVar4;
  IntConstOpnd *this_00;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  bool bVar8;
  bool bVar9;
  OpndKind OVar10;
  uint32 offset;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  JITTimeFunctionBody *this_01;
  PropertyIdArray *pPVar14;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar15;
  undefined1 local_60 [8];
  StackLiteralInitFldData data;
  StackSym *local_40;
  StackSym *sym;
  
  sym = (StackSym *)opnd;
  if (((instr->field_0x36 & 8) != 0) &&
     (bVar6 = ObjectTempVerify::CanMarkTemp(instr,(BackwardPass *)0x0), !bVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41b4,
                       "(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr))",
                       "!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr)");
    if (!bVar6) goto LAB_00472046;
    *puVar11 = 0;
    opnd = (RegOpnd *)sym;
  }
  pBVar2 = this->currentBlock;
  bVar6 = OpCodeAttr::TempObjectProducing(instr->m_opcode);
  if (bVar6) {
    uVar1 = *(ushort *)&instr->field_0x36;
    if ((uVar1 & 8) == 0) {
      bVar6 = false;
    }
    else {
      bVar6 = ObjectTemp::CanStoreTemp(instr);
    }
    bVar9 = SUB41((uVar1 & 8) >> 3,0);
  }
  else {
    bVar6 = OpCodeAttr::TempObjectTransfer(instr->m_opcode);
    if (bVar6) {
      if ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_004719bb:
        bVar9 = false;
      }
      else {
        OVar10 = IR::Opnd::GetKind(instr->m_src1);
        if (OVar10 == OpndKindReg) {
          pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
          pOVar3 = instr->m_src1;
          OVar10 = IR::Opnd::GetKind(pOVar3);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_00472046;
            *puVar11 = 0;
            opnd = (RegOpnd *)sym;
          }
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar13,*(BVIndex *)(pOVar3[1]._vptr_Opnd + 2));
          bVar9 = true;
          if (BVar7 == '\0') goto LAB_004718f6;
        }
        else {
LAB_004718f6:
          if ((instr->m_src2 == (Opnd *)0x0) ||
             (OVar10 = IR::Opnd::GetKind(instr->m_src2), OVar10 != OpndKindReg)) goto LAB_004719bb;
          pBVar13 = (pBVar2->globOptData).maybeTempObjectSyms;
          pOVar3 = instr->m_src2;
          OVar10 = IR::Opnd::GetKind(pOVar3);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_00472046;
            *puVar11 = 0;
            opnd = (RegOpnd *)sym;
          }
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar13,*(BVIndex *)(pOVar3[1]._vptr_Opnd + 2));
          bVar9 = BVar7 != '\0';
        }
      }
      if (((pBVar2->globOptData).canStoreTempObjectSyms ==
           (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
         (OVar10 = IR::Opnd::GetKind(instr->m_src1), OVar10 != OpndKindReg)) {
LAB_00471aa7:
        bVar6 = false;
      }
      else {
        data._8_8_ = (pBVar2->globOptData).canStoreTempObjectSyms;
        pOVar3 = instr->m_src1;
        OVar10 = IR::Opnd::GetKind(pOVar3);
        if (OVar10 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar6) goto LAB_00472046;
          *puVar11 = 0;
          opnd = (RegOpnd *)sym;
        }
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((BVSparse<Memory::JitArenaAllocator> *)data._8_8_,
                           *(BVIndex *)(pOVar3[1]._vptr_Opnd + 2));
        if (BVar7 == '\0') goto LAB_00471aa7;
        if (instr->m_src2 == (Opnd *)0x0) {
          bVar6 = true;
        }
        else {
          OVar10 = IR::Opnd::GetKind(instr->m_src2);
          if (OVar10 != OpndKindReg) goto LAB_00471aa7;
          pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
          pRVar12 = IR::Opnd::AsRegOpnd(instr->m_src2);
          opnd = (RegOpnd *)sym;
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar13,(pRVar12->m_sym->super_Sym).m_id);
          bVar6 = BVar7 != '\0';
        }
      }
      if ((bVar6 != false) && ((instr->field_0x36 & 8) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x41cd,"(!canStoreTemp || instr->dstIsTempObject)",
                           "!canStoreTemp || instr->dstIsTempObject");
        if (!bVar8) goto LAB_00472046;
        *puVar11 = 0;
        opnd = (RegOpnd *)sym;
      }
      if ((bVar9 != false) && ((instr->field_0x36 & 8) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x41ce,"(!maybeTemp || instr->dstIsTempObject)",
                           "!maybeTemp || instr->dstIsTempObject");
        if (!bVar8) goto LAB_00472046;
        *puVar11 = 0;
        opnd = (RegOpnd *)sym;
      }
    }
    else {
      bVar9 = false;
      bVar6 = false;
    }
  }
  local_40 = *(StackSym **)&(((StackSym *)opnd)->super_Sym).m_id;
  if ((local_40->m_type != TyVar) &&
     (local_40 = StackSym::GetVarEquivSym(local_40,(Func *)0x0), local_40 == (StackSym *)0x0)) {
    return;
  }
  i = (local_40->super_Sym).m_id;
  if (bVar9 == false) {
    if (bVar6 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4213,"(!canStoreTemp)","!canStoreTemp");
      if (!bVar6) goto LAB_00472046;
      *puVar11 = 0;
    }
    pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
    if ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      if (pBVar13 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x421e,"(!globOptData.canStoreTempObjectSyms)",
                           "!globOptData.canStoreTempObjectSyms");
        if (!bVar6) goto LAB_00472046;
        *puVar11 = 0;
      }
    }
    else {
      if (pBVar13 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::Clear(pBVar13,i);
      }
      BVSparse<Memory::JitArenaAllocator>::Clear((pBVar2->globOptData).maybeTempObjectSyms,i);
    }
    if ((((this->prePassLoop == (Loop *)0x0) &&
         (pBVar15 = (pBVar2->globOptData).stackLiteralInitFldDataMap,
         pBVar15 !=
         (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)0x0)) && (pBVar15->count != pBVar15->freeCount)) &&
       (bVar6 = JsUtil::
                BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(pBVar15,&local_40), bVar6)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4225,
                         "(this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))"
                         ,
                         "this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)"
                        );
      if (!bVar6) goto LAB_00472046;
      *puVar11 = 0;
    }
  }
  else {
    if (*(StackSym **)&(sym->super_Sym).m_id != local_40) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x41e0,"(opnd->m_sym == sym)","opnd->m_sym == sym");
      if (!bVar9) goto LAB_00472046;
      *puVar11 = 0;
    }
    if ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
      pJVar4 = this->alloc;
      pBVar13->head = (Type_conflict)0x0;
      pBVar13->lastFoundIndex = (Type_conflict)0x0;
      pBVar13->alloc = pJVar4;
      pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
      (pBVar2->globOptData).maybeTempObjectSyms = pBVar13;
    }
    BVSparse<Memory::JitArenaAllocator>::Set((pBVar2->globOptData).maybeTempObjectSyms,i);
    if (bVar6 == false) {
      pBVar13 = (pBVar2->globOptData).canStoreTempObjectSyms;
      if (pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(pBVar13,i);
      return;
    }
    if ((instr->m_opcode == NewScObjectLiteral) && (this->prePassLoop == (Loop *)0x0)) {
      this_00 = (IntConstOpnd *)instr->m_src1;
      OVar10 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar10 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar6) goto LAB_00472046;
        *puVar11 = 0;
      }
      this_01 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      offset = IR::IntConstOpnd::AsUint32(this_00);
      pPVar14 = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(this_01,offset);
      if (pPVar14->hadDuplicates == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x41f8,"(!propIds->hadDuplicates)","!propIds->hadDuplicates");
        if (!bVar6) goto LAB_00472046;
        *puVar11 = 0;
      }
      pBVar15 = (pBVar2->globOptData).stackLiteralInitFldDataMap;
      if (pBVar15 ==
          (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        pBVar15 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::JitArenaAllocator>(0x38,this->alloc,0x3f1274);
        JsUtil::
        BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::BaseDictionary(pBVar15,this->alloc,0);
        (pBVar2->globOptData).stackLiteralInitFldDataMap = pBVar15;
      }
      else {
        bVar6 = JsUtil::
                BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(pBVar15,&local_40);
        if (bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x4200,"(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))",
                             "!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)");
          if (!bVar6) {
LAB_00472046:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
        }
      }
      data.propIds._0_4_ = 0;
      local_60 = (undefined1  [8])pPVar14;
      JsUtil::
      BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)(pBVar2->globOptData).stackLiteralInitFldDataMap,&local_40,
                 (StackLiteralInitFldData *)local_60);
    }
    if ((pBVar2->globOptData).canStoreTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0)
    {
      pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
      pJVar4 = this->alloc;
      pBVar13->head = (Type_conflict)0x0;
      pBVar13->lastFoundIndex = (Type_conflict)0x0;
      pBVar13->alloc = pJVar4;
      pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
      (pBVar2->globOptData).canStoreTempObjectSyms = pBVar13;
    }
    BVSparse<Memory::JitArenaAllocator>::Set((pBVar2->globOptData).canStoreTempObjectSyms,i);
  }
  return;
}

Assistant:

void
GlobOpt::TrackTempObjectSyms(IR::Instr * instr, IR::RegOpnd * opnd)
{
    // If it is marked as dstIsTempObject, we should have mark temped it, or type specialized it to Ld_I4.
    Assert(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr));
    GlobOptBlockData& globOptData = *CurrentBlockData();
    bool canStoreTemp = false;
    bool maybeTemp = false;
    if (OpCodeAttr::TempObjectProducing(instr->m_opcode))
    {
        maybeTemp = instr->dstIsTempObject;

        // We have to make sure that lower will always generate code to do stack allocation
        // before we can store any other stack instance onto it. Otherwise, we would not
        // walk object to box the stack property.
        canStoreTemp = instr->dstIsTempObject && ObjectTemp::CanStoreTemp(instr);
    }
    else if (OpCodeAttr::TempObjectTransfer(instr->m_opcode))
    {
        // Need to check both sources, GetNewScObject has two srcs for transfer.
        // No need to get var equiv sym here as transfer of type spec value does not transfer a mark temp object.
        maybeTemp = globOptData.maybeTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            || (instr->GetSrc2() && instr->GetSrc2()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id)));

        canStoreTemp = globOptData.canStoreTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            && (!instr->GetSrc2() || (instr->GetSrc2()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id))));

        AssertOrFailFast(!canStoreTemp || instr->dstIsTempObject);
        AssertOrFailFast(!maybeTemp || instr->dstIsTempObject);
    }

    // Need to get the var equiv sym as assignment of type specialized sym kill the var sym value anyway.
    StackSym * sym = opnd->m_sym;
    if (!sym->IsVar())
    {
        sym = sym->GetVarEquivSym(nullptr);
        if (sym == nullptr)
        {
            return;
        }
    }

    SymID symId = sym->m_id;
    if (maybeTemp)
    {
        // Only var sym should be temp objects
        Assert(opnd->m_sym == sym);

        if (globOptData.maybeTempObjectSyms == nullptr)
        {
            globOptData.maybeTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
        }
        globOptData.maybeTempObjectSyms->Set(symId);

        if (canStoreTemp)
        {
            if (instr->m_opcode == Js::OpCode::NewScObjectLiteral && !this->IsLoopPrePass())
            {
                // For object literal, we install the final type up front.
                // If there are bailout before we finish initializing all the fields, we need to
                // zero out the rest if we stack allocate the literal, so that the boxing would not
                // try to box trash pointer in the properties.

                // Although object Literal initialization can be done lexically, BailOnNoProfile may cause some path
                // to disappear. Do it is flow base make it easier to stop propagate those entries.

                IR::IntConstOpnd * propertyArrayIdOpnd = instr->GetSrc1()->AsIntConstOpnd();
                const Js::PropertyIdArray * propIds = instr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());

                // Duplicates are removed by parser
                Assert(!propIds->hadDuplicates);

                if (globOptData.stackLiteralInitFldDataMap == nullptr)
                {
                    globOptData.stackLiteralInitFldDataMap = JitAnew(alloc, StackLiteralInitFldDataMap, alloc);
                }
                else
                {
                    Assert(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
                }
                StackLiteralInitFldData data = { propIds, 0};
                globOptData.stackLiteralInitFldDataMap->AddNew(sym, data);
            }

            if (globOptData.canStoreTempObjectSyms == nullptr)
            {
                globOptData.canStoreTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
            }
            globOptData.canStoreTempObjectSyms->Set(symId);
        }
        else if (globOptData.canStoreTempObjectSyms)
        {
            globOptData.canStoreTempObjectSyms->Clear(symId);
        }
    }
    else
    {
        Assert(!canStoreTemp);
        if (globOptData.maybeTempObjectSyms)
        {
            if (globOptData.canStoreTempObjectSyms)
            {
                globOptData.canStoreTempObjectSyms->Clear(symId);
            }
            globOptData.maybeTempObjectSyms->Clear(symId);
        }
        else
        {
            Assert(!globOptData.canStoreTempObjectSyms);
        }

        // The symbol is being assigned to, the sym shouldn't still be in the stackLiteralInitFldDataMap
        Assert(this->IsLoopPrePass() ||
            globOptData.stackLiteralInitFldDataMap == nullptr
            || globOptData.stackLiteralInitFldDataMap->Count() == 0
            || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
    }
}